

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Status.cxx
# Opt level: O1

string * __thiscall cmsys::Status::GetString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  char *pcVar1;
  char *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Kind_ == POSIX) {
    __s = strerror((this->field_1).POSIX_);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
  }
  else if (this->Kind_ == Success) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x844353);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::GetString() const
{
  std::string err;
  switch (this->Kind_) {
    case Kind::Success:
      err = "Success";
      break;
    case Kind::POSIX:
      err = strerror(this->POSIX_);
      break;
#ifdef _WIN32
    case Kind::Windows: {
      LPSTR message = NULL;
      DWORD size = FormatMessageA(
        FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
          FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL, this->Windows_, MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPSTR)&message, 0, NULL);
      err = std::string(message, size);
      LocalFree(message);
    } break;
#endif
  }
  return err;
}